

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintIP(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  ostream *poVar1;
  void *pvVar2;
  bool swap16_local;
  uint8_t *addr_local;
  char *name_local;
  ostream *outStr_local;
  
  if (swap16) {
    poVar1 = std::operator<<(outStr,name);
    poVar1 = std::operator<<(poVar1,": ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(uint)addr[1]);
    poVar1 = std::operator<<(poVar1,".");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*addr);
    poVar1 = std::operator<<(poVar1,".");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[3]);
    poVar1 = std::operator<<(poVar1,".");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)addr[2]);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<(outStr,name);
    poVar1 = std::operator<<(poVar1,": ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(uint)*addr);
    poVar1 = std::operator<<(poVar1,".");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[1]);
    poVar1 = std::operator<<(poVar1,".");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[2]);
    poVar1 = std::operator<<(poVar1,".");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)addr[3]);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EthBasePort::PrintIP(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::dec
               << (int)addr[1] << "." << (int)addr[0] << "." << (int)addr[3] << "." << (int)addr[2]
               << std::endl;
    }
    else {
        outStr << name << ": " << std::dec
               << (int)addr[0] << "." << (int)addr[1] << "." << (int)addr[2] << "." << (int)addr[3]
               << std::endl;
    }
}